

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t sse4_despace_skinny_u2(char *bytes,size_t howmany)

{
  int *in_RDX;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  __m128i x;
  __m128i x_00;
  __m128i alVar7;
  int mask16;
  int mask16_1;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar4 = 0;
  sVar1 = howmany;
  uVar3 = 0;
  while (uVar3 + 0x1f < howmany) {
    local_48 = *(undefined8 *)(bytes + uVar3 + 0x10);
    uStack_40 = *(undefined8 *)(bytes + uVar3 + 0x10 + 8);
    uVar5 = *(undefined8 *)(bytes + uVar3);
    uVar6 = *(undefined8 *)(bytes + uVar3 + 8);
    local_50 = uVar3 + 0x20;
    x[1] = sVar1;
    x[0] = (longlong)&mask16;
    alVar7 = skinnycleanm128(x,in_RDX);
    *(undefined8 *)(bytes + sVar4) = uVar5;
    *(undefined8 *)(bytes + sVar4 + 8) = uVar6;
    lVar2 = (long)(0x10 - POPCOUNT(mask16)) + sVar4;
    x_00[1] = sVar1;
    x_00[0] = (longlong)&mask16;
    uVar5 = local_48;
    uVar6 = uStack_40;
    alVar7 = skinnycleanm128(x_00,alVar7[1]);
    in_RDX = alVar7[1];
    *(undefined8 *)(bytes + lVar2) = uVar5;
    *(undefined8 *)(bytes + lVar2 + 8) = uVar6;
    sVar4 = (0x10 - POPCOUNT(mask16)) + lVar2;
    uVar3 = local_50;
  }
  for (; uVar3 + 0xf < howmany; uVar3 = uVar3 + 0x10) {
    uVar5 = *(undefined8 *)(bytes + uVar3);
    uVar6 = *(undefined8 *)(bytes + uVar3 + 8);
    alVar7[1] = sVar1;
    alVar7[0] = (longlong)&mask16_1;
    alVar7 = skinnycleanm128(alVar7,in_RDX);
    in_RDX = alVar7[1];
    *(undefined8 *)(bytes + sVar4) = uVar5;
    *(undefined8 *)(bytes + sVar4 + 8) = uVar6;
    sVar4 = sVar4 + (long)(0x10 - POPCOUNT(mask16_1));
  }
  for (; uVar3 < howmany; uVar3 = uVar3 + 1) {
    if (' ' < bytes[uVar3]) {
      bytes[sVar4] = bytes[uVar3];
      sVar4 = sVar4 + 1;
    }
  }
  return sVar4;
}

Assistant:

size_t sse4_despace_skinny_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));

    int mask16;
    x1 = skinnycleanm128(x1, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = skinnycleanm128(x2, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = skinnycleanm128(x, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if( (int) c <= 0x20) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}